

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::OnReleaseTexture(RenderDeviceGLImpl *this,ITexture *pTexture)

{
  __node_base *p_Var1;
  
  Threading::SpinLock::lock(&this->m_FBOCacheLock);
  p_Var1 = &(this->m_FBOCache)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    FBOCache::OnReleaseTexture((FBOCache *)(p_Var1 + 2),pTexture);
  }
  Threading::SpinLock::unlock(&this->m_FBOCacheLock);
  return;
}

Assistant:

void RenderDeviceGLImpl::OnReleaseTexture(ITexture* pTexture)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    for (auto& FBOCacheIt : m_FBOCache)
        FBOCacheIt.second.OnReleaseTexture(pTexture);
}